

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O3

uint32_t __thiscall
jsoncons::basic_json_parser<wchar_t,_std::allocator<char>_>::append_to_codepoint
          (basic_json_parser<wchar_t,_std::allocator<char>_> *this,uint32_t cp,int c,error_code *ec)

{
  bool bVar1;
  uint32_t uVar2;
  json_errc local_1c;
  
  uVar2 = cp * 0x10;
  if (c - 0x30U < 10) {
    uVar2 = uVar2 | c - 0x30U;
  }
  else if (c - 0x61U < 6) {
    uVar2 = (uVar2 + c) - 0x57;
  }
  else if (c - 0x41U < 6) {
    uVar2 = (uVar2 + c) - 0x37;
  }
  else {
    local_1c = invalid_unicode_escape_sequence;
    if ((this->err_handler_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    bVar1 = (*(this->err_handler_)._M_invoker)
                      ((_Any_data *)&this->err_handler_,&local_1c,&this->super_ser_context);
    this->more_ = bVar1;
    if (!bVar1) {
      std::error_code::operator=(ec,invalid_unicode_escape_sequence);
    }
  }
  return uVar2;
}

Assistant:

uint32_t append_to_codepoint(uint32_t cp, int c, std::error_code& ec)
    {
        cp *= 16;
        if (c >= '0'  &&  c <= '9')
        {
            cp += c - '0';
        }
        else if (c >= 'a'  &&  c <= 'f')
        {
            cp += c - 'a' + 10;
        }
        else if (c >= 'A'  &&  c <= 'F')
        {
            cp += c - 'A' + 10;
        }
        else
        {
            more_ = err_handler_(json_errc::invalid_unicode_escape_sequence, *this);
            if (!more_)
            {
                ec = json_errc::invalid_unicode_escape_sequence;
                return cp;
            }
        }
        return cp;
    }